

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_hashtable.cc
# Opt level: O3

void __thiscall PF_HashTable::~PF_HashTable(PF_HashTable *this)

{
  PF_HashEntry *pPVar1;
  int iVar2;
  PF_HashEntry *pPVar3;
  long lVar4;
  
  iVar2 = this->numBuckets;
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      pPVar3 = this->hashTable[lVar4];
      if (this->hashTable[lVar4] != (PF_HashEntry *)0x0) {
        do {
          pPVar1 = pPVar3->next;
          operator_delete(pPVar3);
          pPVar3 = pPVar1;
        } while (pPVar1 != (PF_HashEntry *)0x0);
        iVar2 = this->numBuckets;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  if (this->hashTable != (PF_HashEntry **)0x0) {
    operator_delete__(this->hashTable);
    return;
  }
  return;
}

Assistant:

PF_HashTable::~PF_HashTable()
{
  // Clear out all buckets
  for (int i = 0; i < numBuckets; i++) {

    // Delete all entries in the bucket
    PF_HashEntry *entry = hashTable[i];
    while (entry != NULL) {
      PF_HashEntry *next = entry->next;
      delete entry;
      entry = next;
    }
  }

  // Finally delete the hash table
  delete[] hashTable;
}